

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _Ios_Seekdir _Var1;
  long lVar2;
  long lVar3;
  _Alloc_hider *p_Var4;
  size_t sVar5;
  undefined1 auVar6 [8];
  char cVar7;
  bool bVar8;
  mapped_type mVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  typed_value<int,_char> *ptVar13;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar14;
  basic_command_line_parser<char> *this;
  size_type sVar15;
  ostream *poVar16;
  any *paVar17;
  uint *puVar18;
  mapped_type *pmVar19;
  int *piVar20;
  _Ios_Seekdir *p_Var21;
  ulong uVar22;
  int *arg;
  int *arg_00;
  int i;
  undefined4 uVar23;
  undefined8 uVar24;
  key_type *pkVar25;
  pointer pbVar26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar28;
  token_compress_mode_type eCompress;
  ulong uVar29;
  undefined8 uStack_520;
  undefined1 auStack_518 [16];
  options_description desc;
  is_any_ofF<char> local_490;
  positional_options_description local_478 [8];
  positional_options_description p;
  undefined1 local_440 [8];
  ifstream source_file;
  byte abStack_420 [488];
  is_any_ofF<char> local_238;
  undefined1 local_220 [8];
  string intapetmp;
  char *local_1e8;
  string filename;
  string outtape;
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_198 [144];
  undefined1 local_108 [8];
  string fetch;
  undefined1 local_d8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  know_label;
  char *local_a0;
  undefined1 auStack_98 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  intape;
  undefined1 auStack_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  line;
  undefined1 auStack_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  line_1;
  uint local_38;
  allocator<char> local_31;
  
  uVar24 = auStack_518;
  uStack_520 = 0x11276c;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_440,"SimRam - RAM Emulator",
             (allocator<char> *)(outtape.field_2._M_local_buf + 8));
  uStack_520 = 0x11278c;
  boost::program_options::options_description::options_description
            ((options_description *)(auStack_518 + 8),(string *)local_440,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  uStack_520 = 0x112798;
  std::__cxx11::string::~string((string *)local_440);
  uStack_520 = 0x1127a4;
  local_440 = (undefined1  [8])boost::program_options::options_description::add_options();
  uStack_520 = 0x1127c1;
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (local_440,"help,h");
  uStack_520 = 0x1127d7;
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,"verbose,v");
  uStack_520 = 0x1127df;
  ptVar13 = boost::program_options::value<int>();
  uStack_520 = 0x1127f8;
  pcVar12 = (char *)boost::program_options::options_description_easy_init::operator()
                              (pcVar12,(value_semantic *)"registers,r",(char *)ptVar13);
  uStack_520 = 0x112800;
  ptVar14 = boost::program_options::value<std::__cxx11::string>();
  uStack_520 = 0x112819;
  boost::program_options::options_description_easy_init::operator()
            (pcVar12,(value_semantic *)"input,i",(char *)ptVar14);
  uStack_520 = 0x112825;
  boost::program_options::positional_options_description::positional_options_description(local_478);
  uStack_520 = 0x11283b;
  boost::program_options::positional_options_description::add((char *)local_478,0x11a0da);
  uStack_520 = 0x112847;
  boost::program_options::variables_map::variables_map
            ((variables_map *)(outtape.field_2._M_local_buf + 8));
  uStack_520 = 0x112859;
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)local_440,argc,argv);
  uStack_520 = 0x11286c;
  this = boost::program_options::basic_command_line_parser<char>::options
                   ((basic_command_line_parser<char> *)local_440,
                    (options_description *)(auStack_518 + 8));
  uStack_520 = 0x11287e;
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)this);
  uStack_520 = 0x11288d;
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)local_d8,this);
  uStack_520 = 0x1128a2;
  boost::program_options::store
            ((basic_parsed_options *)local_d8,(variables_map *)(outtape.field_2._M_local_buf + 8),
             false);
  uStack_520 = 0x1128ae;
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_d8);
  uStack_520 = 0x1128ba;
  boost::program_options::detail::cmdline::~cmdline((cmdline *)local_440);
  uStack_520 = 0x1128c6;
  boost::program_options::notify((variables_map *)(outtape.field_2._M_local_buf + 8));
  uStack_520 = 0x1128e0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_440,"help",(allocator<char> *)local_d8);
  uStack_520 = 0x1128f6;
  sVar15 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count(local_198,(key_type *)local_440);
  uStack_520 = 0x112905;
  std::__cxx11::string::~string((string *)local_440);
  if (sVar15 == 0) {
    uStack_520 = 0x112948;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_440,"reg",(allocator<char> *)local_d8);
    uStack_520 = 0x112957;
    sVar15 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count(local_198,(key_type *)local_440);
    uStack_520 = 0x112966;
    std::__cxx11::string::~string((string *)local_440);
    if (sVar15 == 0) {
      local_38 = 5;
    }
    else {
      uStack_520 = 0x112989;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_440,"reg",(allocator<char> *)local_d8);
      uStack_520 = 0x11299c;
      paVar17 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)(outtape.field_2._M_local_buf + 8));
      uStack_520 = 0x1129a4;
      puVar18 = (uint *)boost::any_cast<int_const&>(paVar17);
      local_38 = *puVar18;
      uStack_520 = 0x1129b5;
      std::__cxx11::string::~string((string *)local_440);
      uStack_520 = 0x1129cf;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_440,"verbose",(allocator<char> *)local_d8);
      uStack_520 = 0x1129de;
      sVar15 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count(local_198,(key_type *)local_440);
      uStack_520 = 0x1129ed;
      std::__cxx11::string::~string((string *)local_440);
      if (sVar15 != 0) {
        uStack_520 = 0x112a05;
        poVar16 = std::operator<<((ostream *)&std::cout,
                                  "The number of virtual registers was set to ");
        uStack_520 = 0x112a10;
        poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,local_38);
        uStack_520 = 0x112a18;
        std::endl<char,std::char_traits<char>>(poVar16);
      }
    }
    uStack_520 = 0x112a3a;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"input.ram",(allocator<char> *)local_440);
    uStack_520 = 0x112a54;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_440,"input",(allocator<char> *)local_d8);
    uStack_520 = 0x112a63;
    sVar15 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count(local_198,(key_type *)local_440);
    uStack_520 = 0x112a72;
    std::__cxx11::string::~string((string *)local_440);
    if (sVar15 != 0) {
      uStack_520 = 0x112a95;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_440,"input",(allocator<char> *)local_d8);
      uStack_520 = 0x112aa8;
      paVar17 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)(outtape.field_2._M_local_buf + 8));
      uStack_520 = 0x112ab0;
      boost::any_cast<std::__cxx11::string_const&>(paVar17);
      uStack_520 = 0x112abf;
      std::__cxx11::string::_M_assign((string *)&local_1e8);
      uStack_520 = 0x112acb;
      std::__cxx11::string::~string((string *)local_440);
      uStack_520 = 0x112ae5;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_440,"verbose",(allocator<char> *)local_d8);
      uStack_520 = 0x112af4;
      sVar15 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count(local_198,(key_type *)local_440);
      uStack_520 = 0x112b03;
      std::__cxx11::string::~string((string *)local_440);
      if (sVar15 != 0) {
        uStack_520 = 0x112b1b;
        poVar16 = std::operator<<((ostream *)&std::cout,"The source code was set to \'");
        uStack_520 = 0x112b2a;
        poVar16 = std::operator<<(poVar16,(string *)&local_1e8);
        uStack_520 = 0x112b39;
        poVar16 = std::operator<<(poVar16,"\'");
        uStack_520 = 0x112b41;
        std::endl<char,std::char_traits<char>>(poVar16);
      }
    }
    uStack_520 = 0x112b57;
    std::ifstream::ifstream(local_440,local_1e8,_S_in);
    uStack_520 = 0x112b63;
    cVar7 = std::__basic_file<char>::is_open();
    if (cVar7 == '\0') {
      uStack_520 = 0x112dcf;
      poVar16 = std::operator<<((ostream *)&std::cout,"<!> Unable to open file");
      uStack_520 = 0x112dd7;
      std::endl<char,std::char_traits<char>>(poVar16);
      uStack_520 = 1;
      eCompress = token_compress_off;
    }
    else {
      lVar3 = -((ulong)local_38 * 4 + 0xf & 0xfffffffffffffff0);
      line_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(auStack_518 + lVar3);
      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112b9c;
      memset((pointer)(auStack_518 + lVar3),0,(long)(int)local_38 << 2);
      local_220 = (undefined1  [8])&intapetmp._M_string_length;
      intapetmp._M_dataplus._M_p = (pointer)0x0;
      filename.field_2._8_8_ = &outtape._M_string_length;
      outtape._M_dataplus._M_p = (pointer)0x0;
      intapetmp._M_string_length._0_1_ = 0;
      outtape._M_string_length._0_1_ = 0;
      auStack_98 = (undefined1  [8])0x0;
      intape.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      intape.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112be2;
      std::operator<<((ostream *)&std::cout,"Insert input tape (use comma for insert new value): ");
      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112bf5;
      std::operator>>((istream *)&std::cin,(string *)local_220);
      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112c08;
      boost::algorithm::is_any_of<char[2]>
                ((is_any_ofF<char> *)((long)&intapetmp.field_2 + 8),(char (*) [2])",");
      *(undefined8 *)(auStack_518 + lVar3 + -8) = 1;
      uVar24 = *(undefined8 *)(auStack_518 + lVar3 + -8);
      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112c25;
      boost::algorithm::
      split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)auStack_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
                 (is_any_ofF<char> *)((long)&intapetmp.field_2 + 8),(token_compress_mode_type)uVar24
                );
      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112c31;
      boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF
                ((is_any_ofF<char> *)((long)&intapetmp.field_2 + 8));
      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112c4b;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_d8,"verbose",(allocator<char> *)local_108);
      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112c5a;
      sVar15 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count(local_198,(key_type *)local_d8);
      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112c69;
      std::__cxx11::string::~string((string *)local_d8);
      if (sVar15 != 0) {
        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112c81;
        poVar16 = std::operator<<((ostream *)&std::cout,"There are ");
        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112c9b;
        poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112caa;
        poVar16 = std::operator<<(poVar16," values in the tape.");
        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112cb2;
        std::endl<char,std::char_traits<char>>(poVar16);
      }
      fetch.field_2._8_8_ = auStack_518;
      local_108 = (undefined1  [8])&fetch._M_string_length;
      fetch._M_dataplus._M_p = (pointer)0x0;
      know_label._M_t._M_impl._0_4_ = 0;
      know_label._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      know_label._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      know_label._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&know_label;
      know_label._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&know_label;
      know_label._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      fetch._M_string_length._0_1_ = 0;
      while (lVar2 = *(long *)((long)local_440 + -0x18), (abStack_420[lVar2] & 2) == 0) {
        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112d28;
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_440,(string *)local_108);
        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112d33;
        bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_108,"halt");
        if ((!bVar8) && (*(char *)local_108 != '#')) {
          auStack_78 = (undefined1  [8])0x0;
          line.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          line.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112d5e;
          boost::algorithm::is_any_of<char[2]>(&local_490,(char (*) [2])0x11a334);
          *(undefined8 *)(auStack_518 + lVar3 + -8) = 1;
          uVar24 = *(undefined8 *)(auStack_518 + lVar3 + -8);
          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112d70;
          boost::algorithm::
          split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)auStack_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     &local_490,(token_compress_mode_type)uVar24);
          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112d78;
          boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_490);
          auVar6 = auStack_78;
          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112d88;
          bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)auVar6,"label");
          if (bVar8) {
            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112d94;
            mVar9 = std::istream::tellg();
            pkVar25 = (key_type *)((long)auStack_78 + 0x20);
            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112dab;
            pmVar19 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                    *)local_d8,pkVar25);
            *pmVar19 = mVar9;
          }
          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112db7;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_78);
        }
      }
      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112df2;
      std::ios::clear((int)lVar2 + (int)&stack0xfffffffffffffff8 + 0xfffffbc8);
      intape.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112e0a;
      std::istream::seekg((long)local_440,_S_beg);
      uVar22 = 0;
      if (0 < (int)local_38) {
        uVar22 = (ulong)local_38;
      }
      pbVar28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108;
      *(undefined8 *)(auStack_518 + lVar3 + -8) = 1;
      eCompress = (token_compress_mode_type)*(undefined8 *)(auStack_518 + lVar3 + -8);
LAB_00112e3e:
      if ((abStack_420[*(long *)((long)local_440 + -0x18)] & 2) == 0) {
        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112e66;
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_440,(string *)pbVar28);
        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112e71;
        bVar8 = std::operator==(pbVar28,"halt");
        if (bVar8) {
          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11456c;
          poVar16 = std::operator<<((ostream *)&std::cout,"Completed execution with output: ");
          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11457b;
          poVar16 = std::operator<<(poVar16,(string *)(filename.field_2._M_local_buf + 8));
          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114583;
          std::endl<char,std::char_traits<char>>(poVar16);
          goto LAB_00114583;
        }
        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112e88;
        bVar8 = std::operator==(pbVar28,"");
        if ((!bVar8) && (*(char *)local_108 != '#')) {
          local_a0 = "<!> The input tape is finished.";
          know_label._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&std::cerr;
          auStack_58 = (undefined1  [8])0x0;
          line_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          line_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112ec5;
          boost::algorithm::is_any_of<char[2]>(&local_238,(char (*) [2])0x11a334);
          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112ede;
          boost::algorithm::
          split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)auStack_58,pbVar28,&local_238,eCompress);
          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112ee6;
          boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_238);
          auVar6 = auStack_58;
          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112ef6;
          bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)auVar6,"read");
          auVar6 = auStack_58;
          uVar29 = (ulong)(int)intape.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (bVar8) {
            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112f19;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)auStack_78,"verbose",&local_31);
            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112f28;
            sVar15 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     ::count(local_198,(key_type *)auStack_78);
            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112f33;
            std::__cxx11::string::~string((string *)auStack_78);
            if (sVar15 != 0) {
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112f4b;
              poVar16 = std::operator<<((ostream *)&std::cout,"Read: ");
              pbVar26 = (pointer)((long)auStack_98 + uVar29 * 0x20);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112f61;
              poVar16 = std::operator<<(poVar16,(string *)pbVar26);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112f70;
              poVar16 = std::operator<<(poVar16," --> M[");
              pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)auStack_58 + 0x20);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112f80;
              poVar16 = std::operator<<(poVar16,(string *)pbVar27);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112f8f;
              poVar16 = std::operator<<(poVar16,"]");
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112f97;
              std::endl<char,std::char_traits<char>>(poVar16);
            }
            pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)auStack_58 + 0x20);
            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112fa4;
            iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112fae;
            bVar8 = error_registers(iVar10,local_38);
            if (bVar8) goto LAB_001146c1;
            if (uVar29 < (ulong)((long)intape.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_98
                                >> 5)) {
              pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)auStack_98 + uVar29 * 0x20);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112fe0;
              iVar11 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
              pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)auStack_58 + 0x20);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x112fef;
              iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
LAB_0011312f:
              *(int *)((long)&((line_1.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus).
                              _M_p + (long)iVar10 * 4) = iVar11;
              intape.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)(ulong)((int)intape.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
              goto LAB_0011313c;
            }
LAB_001146a6:
            sVar5 = know_label._M_t._M_impl.super__Rb_tree_header._M_node_count;
            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1146b9;
            poVar16 = std::operator<<((ostream *)sVar5,local_a0);
            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1146c1;
            std::endl<char,std::char_traits<char>>(poVar16);
          }
          else {
            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11300a;
            bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)auVar6,"read*");
            auVar6 = auStack_58;
            if (bVar8) {
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113029;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)auStack_78,"verbose",&local_31);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113038;
              sVar15 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::count(local_198,(key_type *)auStack_78);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113043;
              std::__cxx11::string::~string((string *)auStack_78);
              if (sVar15 != 0) {
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11305b;
                poVar16 = std::operator<<((ostream *)&std::cout,"Read: ");
                pbVar26 = (pointer)((long)auStack_98 + uVar29 * 0x20);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113071;
                poVar16 = std::operator<<(poVar16,(string *)pbVar26);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113080;
                poVar16 = std::operator<<(poVar16," --> M[M[");
                pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)auStack_58 + 0x20);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113090;
                poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11309f;
                poVar16 = std::operator<<(poVar16,"]]");
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1130a7;
                std::endl<char,std::char_traits<char>>(poVar16);
              }
              pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)auStack_58 + 0x20);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1130b4;
              iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1130be;
              bVar8 = error_registers(iVar10,local_38);
              if (!bVar8) {
                pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)auStack_58 + 0x20);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1130d3;
                iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                iVar10 = *(int *)((long)&((line_1.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + (long)iVar10 * 4);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1130e4;
                bVar8 = error_registers(iVar10,local_38);
                if (!bVar8) {
                  if (uVar29 < (ulong)((long)intape.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start -
                                       (long)auStack_98 >> 5)) {
                    pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)auStack_98 + uVar29 * 0x20);
                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113116;
                    iVar11 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                    pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)auStack_58 + 0x20);
                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113125;
                    iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                    iVar10 = *(int *)((long)&((line_1.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                             _M_dataplus)._M_p + (long)iVar10 * 4);
                    goto LAB_0011312f;
                  }
                  goto LAB_001146a6;
                }
              }
              goto LAB_001146c1;
            }
            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113168;
            bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)auVar6,"write");
            auVar6 = auStack_58;
            if (bVar8) {
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113183;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)auStack_78,"verbose",&local_31);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113192;
              sVar15 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::count(local_198,(key_type *)auStack_78);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11319d;
              std::__cxx11::string::~string((string *)auStack_78);
              if (sVar15 != 0) {
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1131b5;
                poVar16 = std::operator<<((ostream *)&std::cout,"Write: M[");
                pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)auStack_58 + 0x20);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1131c5;
                poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1131d4;
                poVar16 = std::operator<<(poVar16,"] = ");
                pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)auStack_58 + 0x20);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1131e4;
                iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                iVar10 = *(int *)((long)&((line_1.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + (long)iVar10 * 4);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1131f5;
                poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,iVar10);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1131fd;
                std::endl<char,std::char_traits<char>>(poVar16);
              }
              pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)auStack_58 + 0x20);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11320a;
              iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113214;
              bVar8 = error_registers(iVar10,local_38);
              if (bVar8) goto LAB_001146c1;
              pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)auStack_58 + 0x20);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113229;
              iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
              p_Var4 = &(line_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus;
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11323f;
              boost::lexical_cast<std::__cxx11::string,int>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_78,(boost *)((long)&p_Var4->_M_p + (long)iVar10 * 4),arg);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11324e;
              std::__cxx11::string::append((string *)(filename.field_2._M_local_buf + 8));
LAB_001133bc:
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1133c4;
              std::__cxx11::string::~string((string *)auStack_78);
LAB_0011313c:
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113145;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_58);
              goto LAB_00112e3e;
            }
            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113263;
            bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)auVar6,"write=");
            auVar6 = auStack_58;
            if (bVar8) {
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11327a;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)auStack_78,"verbose",&local_31);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113289;
              sVar15 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::count(local_198,(key_type *)auStack_78);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113294;
              std::__cxx11::string::~string((string *)auStack_78);
              if (sVar15 != 0) {
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1132ac;
                poVar16 = std::operator<<((ostream *)&std::cout,"Write: ");
                pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)auStack_58 + 0x20);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1132bc;
                poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1132c4;
                std::endl<char,std::char_traits<char>>(poVar16);
              }
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1132d8;
              std::__cxx11::string::append((string *)(filename.field_2._M_local_buf + 8));
              goto LAB_0011313c;
            }
            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1132ed;
            bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)auVar6,"write*");
            auVar6 = auStack_58;
            if (bVar8) {
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113308;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)auStack_78,"verbose",&local_31);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113317;
              sVar15 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::count(local_198,(key_type *)auStack_78);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113322;
              std::__cxx11::string::~string((string *)auStack_78);
              if (sVar15 != 0) {
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11333a;
                poVar16 = std::operator<<((ostream *)&std::cout,"Write: M[M[");
                pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)auStack_58 + 0x20);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11334a;
                poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113359;
                poVar16 = std::operator<<(poVar16,"]] = ");
                pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)auStack_58 + 0x20);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113369;
                iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                iVar10 = *(int *)((long)&((line_1.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p +
                                 (long)*(int *)((long)&((line_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p + (long)iVar10 * 4) * 4);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11337e;
                poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,iVar10);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113386;
                std::endl<char,std::char_traits<char>>(poVar16);
              }
              pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)auStack_58 + 0x20);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113393;
              iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
              iVar10 = *(int *)((long)&((line_1.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + (long)iVar10 * 4);
              p_Var4 = &(line_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus;
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1133ad;
              boost::lexical_cast<std::__cxx11::string,int>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_78,(boost *)((long)&p_Var4->_M_p + (long)iVar10 * 4),arg_00);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1133bc;
              std::__cxx11::string::append((string *)(filename.field_2._M_local_buf + 8));
              goto LAB_001133bc;
            }
            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1133d9;
            bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)auVar6,"load");
            auVar6 = auStack_58;
            if (bVar8) {
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1133f4;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)auStack_78,"verbose",&local_31);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113403;
              sVar15 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::count(local_198,(key_type *)auStack_78);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11340e;
              std::__cxx11::string::~string((string *)auStack_78);
              if (sVar15 != 0) {
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113426;
                poVar16 = std::operator<<((ostream *)&std::cout,"M[");
                pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)auStack_58 + 0x20);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113436;
                poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113445;
                poVar16 = std::operator<<(poVar16,"] --> Working Memory");
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11344d;
                std::endl<char,std::char_traits<char>>(poVar16);
              }
              pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)auStack_58 + 0x20);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11345a;
              iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113464;
              bVar8 = error_registers(iVar10,local_38);
              if (!bVar8) {
                pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)auStack_58 + 0x20);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113479;
                iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
LAB_0011347f:
                iVar10 = *(int *)((long)&((line_1.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + (long)iVar10 * 4);
                goto LAB_0011351c;
              }
              goto LAB_001146c1;
            }
            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113497;
            bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)auVar6,"load=");
            auVar6 = auStack_58;
            if (bVar8) {
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1134b2;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)auStack_78,"verbose",&local_31);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1134c1;
              sVar15 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::count(local_198,(key_type *)auStack_78);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1134cc;
              std::__cxx11::string::~string((string *)auStack_78);
              if (sVar15 != 0) {
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1134e4;
                poVar16 = std::operator<<((ostream *)&std::cout,"Value: ");
                pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)auStack_58 + 0x20);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1134f4;
                poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113503;
                poVar16 = std::operator<<(poVar16," --> Working Memory");
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11350b;
                std::endl<char,std::char_traits<char>>(poVar16);
              }
              pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)auStack_58 + 0x20);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113518;
              iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
              goto LAB_0011351c;
            }
            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113533;
            bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)auVar6,"load*");
            auVar6 = auStack_58;
            if (bVar8) {
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11354e;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)auStack_78,"verbose",&local_31);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11355d;
              sVar15 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       ::count(local_198,(key_type *)auStack_78);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113568;
              std::__cxx11::string::~string((string *)auStack_78);
              if (sVar15 != 0) {
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113580;
                poVar16 = std::operator<<((ostream *)&std::cout,"M[M[");
                pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)auStack_58 + 0x20);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113590;
                poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11359f;
                poVar16 = std::operator<<(poVar16,"]] --> Working Memory");
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1135a7;
                std::endl<char,std::char_traits<char>>(poVar16);
              }
              pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)auStack_58 + 0x20);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1135b4;
              iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1135be;
              bVar8 = error_registers(iVar10,local_38);
              if (!bVar8) {
                pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)auStack_58 + 0x20);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1135d3;
                iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                iVar10 = *(int *)((long)&((line_1.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + (long)iVar10 * 4);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1135e4;
                bVar8 = error_registers(iVar10,local_38);
                if (!bVar8) {
                  pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)auStack_58 + 0x20);
                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1135f9;
                  iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                  iVar10 = *(int *)((long)&((line_1.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           _M_dataplus)._M_p + (long)iVar10 * 4);
                  goto LAB_0011347f;
                }
              }
            }
            else {
              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113618;
              bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)auVar6,"store");
              auVar6 = auStack_58;
              if (bVar8) {
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113633;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)auStack_78,"verbose",&local_31);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113642;
                sVar15 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                         ::count(local_198,(key_type *)auStack_78);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11364d;
                std::__cxx11::string::~string((string *)auStack_78);
                if (sVar15 != 0) {
                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113665;
                  poVar16 = std::operator<<((ostream *)&std::cout,"Working Memory --> M[");
                  pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)auStack_58 + 0x20);
                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113675;
                  poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113684;
                  poVar16 = std::operator<<(poVar16,"]");
                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11368c;
                  std::endl<char,std::char_traits<char>>(poVar16);
                }
                pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)auStack_58 + 0x20);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113699;
                iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1136a3;
                bVar8 = error_registers(iVar10,local_38);
                if (!bVar8) {
                  uVar23 = *(undefined4 *)
                            &((line_1.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus).
                             _M_p;
                  pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)auStack_58 + 0x20);
                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1136be;
                  iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
LAB_001137b1:
                  *(undefined4 *)
                   ((long)&((line_1.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus)._M_p
                   + (long)iVar10 * 4) = uVar23;
                  goto LAB_0011313c;
                }
              }
              else {
                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1136d9;
                bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)auVar6,"store*");
                auVar6 = auStack_58;
                if (bVar8) {
                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1136f4;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)auStack_78,"verbose",&local_31);
                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113704;
                  sVar15 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                           ::count(local_198,(key_type *)auStack_78);
                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113710;
                  std::__cxx11::string::~string((string *)auStack_78);
                  if (sVar15 != 0) {
                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113728;
                    poVar16 = std::operator<<((ostream *)&std::cout,"Working Memory --> M[M[");
                    pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)auStack_58 + 0x20);
                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113738;
                    poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113747;
                    poVar16 = std::operator<<(poVar16,"]]");
                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11374f;
                    std::endl<char,std::char_traits<char>>(poVar16);
                  }
                  pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)auStack_58 + 0x20);
                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11375c;
                  iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113766;
                  bVar8 = error_registers(iVar10,local_38);
                  if (!bVar8) {
                    pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)auStack_58 + 0x20);
                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11377b;
                    iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                    iVar10 = *(int *)((long)&((line_1.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                             _M_dataplus)._M_p + (long)iVar10 * 4);
                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11378c;
                    bVar8 = error_registers(iVar10,local_38);
                    if (!bVar8) {
                      uVar23 = *(undefined4 *)
                                &((line_1.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus)
                                 ._M_p;
                      pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)auStack_58 + 0x20);
                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1137a7;
                      iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                      iVar10 = *(int *)((long)&((line_1.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->_M_dataplus)._M_p + (long)iVar10 * 4);
                      goto LAB_001137b1;
                    }
                  }
                }
                else {
                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1137c9;
                  bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)auVar6,"add");
                  auVar6 = auStack_58;
                  if (bVar8) {
                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1137e5;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)auStack_78,"verbose",&local_31);
                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1137f5;
                    sVar15 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                             ::count(local_198,(key_type *)auStack_78);
                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113801;
                    std::__cxx11::string::~string((string *)auStack_78);
                    if (sVar15 != 0) {
                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113819;
                      poVar16 = std::operator<<((ostream *)&std::cout,"M[0] + M[");
                      pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)auStack_58 + 0x20);
                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113829;
                      poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113838;
                      poVar16 = std::operator<<(poVar16,"] --> M[0]");
                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113840;
                      std::endl<char,std::char_traits<char>>(poVar16);
                    }
                    pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)auStack_58 + 0x20);
                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11384d;
                    iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113857;
                    bVar8 = error_registers(iVar10,local_38);
                    if (!bVar8) {
                      iVar10 = *(int *)&((line_1.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                        _M_dataplus)._M_p;
                      pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)auStack_58 + 0x20);
                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113872;
                      iVar11 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
LAB_00113878:
                      iVar10 = iVar10 + *(int *)((long)&((line_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p + (long)iVar11 * 4);
LAB_0011387b:
                      *(int *)&((line_1.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus).
                               _M_p = iVar10;
                      goto LAB_0011313c;
                    }
                  }
                  else {
                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113892;
                    bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)auVar6,"add=");
                    auVar6 = auStack_58;
                    if (bVar8) {
                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1138ae;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)auStack_78,"verbose",&local_31);
                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1138be;
                      sVar15 = std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                               ::count(local_198,(key_type *)auStack_78);
                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1138ca;
                      std::__cxx11::string::~string((string *)auStack_78);
                      if (sVar15 != 0) {
                        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1138e2;
                        poVar16 = std::operator<<((ostream *)&std::cout,"M[0] + ");
                        pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)auStack_58 + 0x20);
                        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1138f2;
                        poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113901;
                        poVar16 = std::operator<<(poVar16," --> M[0]");
                        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113909;
                        std::endl<char,std::char_traits<char>>(poVar16);
                      }
                      iVar11 = *(int *)&((line_1.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                        _M_dataplus)._M_p;
                      pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)auStack_58 + 0x20);
                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11391c;
                      iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                      iVar10 = iVar10 + iVar11;
                      goto LAB_0011351c;
                    }
                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113933;
                    bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)auVar6,"add*");
                    auVar6 = auStack_58;
                    if (bVar8) {
                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11394f;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)auStack_78,"verbose",&local_31);
                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11395f;
                      sVar15 = std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                               ::count(local_198,(key_type *)auStack_78);
                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11396b;
                      std::__cxx11::string::~string((string *)auStack_78);
                      if (sVar15 != 0) {
                        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113983;
                        poVar16 = std::operator<<((ostream *)&std::cout,"M[0] + M[M[");
                        pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)auStack_58 + 0x20);
                        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113993;
                        poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1139a2;
                        poVar16 = std::operator<<(poVar16,"]] --> M[0]");
                        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1139aa;
                        std::endl<char,std::char_traits<char>>(poVar16);
                      }
                      pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)auStack_58 + 0x20);
                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1139b7;
                      iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1139c1;
                      bVar8 = error_registers(iVar10,local_38);
                      if (!bVar8) {
                        pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)auStack_58 + 0x20);
                        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1139d6;
                        iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                        iVar10 = *(int *)((long)&((line_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p + (long)iVar10 * 4);
                        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1139e7;
                        bVar8 = error_registers(iVar10,local_38);
                        if (!bVar8) {
                          iVar10 = *(int *)&((line_1.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                            _M_dataplus)._M_p;
                          pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)auStack_58 + 0x20);
                          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113a02;
                          iVar11 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                          iVar11 = *(int *)((long)&((line_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p + (long)iVar11 * 4);
                          goto LAB_00113878;
                        }
                      }
                    }
                    else {
                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113a21;
                      bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)auVar6,"sub");
                      auVar6 = auStack_58;
                      if (bVar8) {
                        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113a3d;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)auStack_78,"verbose",&local_31);
                        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113a4d;
                        sVar15 = std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                 ::count(local_198,(key_type *)auStack_78);
                        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113a59;
                        std::__cxx11::string::~string((string *)auStack_78);
                        if (sVar15 != 0) {
                          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113a71;
                          poVar16 = std::operator<<((ostream *)&std::cout,"M[0] - M[");
                          pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)auStack_58 + 0x20);
                          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113a81;
                          poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113a90;
                          poVar16 = std::operator<<(poVar16,"] --> M[0]");
                          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113a98;
                          std::endl<char,std::char_traits<char>>(poVar16);
                        }
                        pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)auStack_58 + 0x20);
                        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113aa5;
                        iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113aaf;
                        bVar8 = error_registers(iVar10,local_38);
                        if (!bVar8) {
                          iVar10 = *(int *)&((line_1.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                            _M_dataplus)._M_p;
                          pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)auStack_58 + 0x20);
                          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113aca;
                          iVar11 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
LAB_00113ad0:
                          iVar10 = iVar10 - *(int *)((long)&((line_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p + (long)iVar11 * 4);
                          goto LAB_0011387b;
                        }
                      }
                      else {
                        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113ae8;
                        bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)auVar6,"sub=");
                        auVar6 = auStack_58;
                        if (bVar8) {
                          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113b04;
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)auStack_78,"verbose",&local_31);
                          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113b14;
                          sVar15 = std::
                                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                   ::count(local_198,(key_type *)auStack_78);
                          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113b20;
                          std::__cxx11::string::~string((string *)auStack_78);
                          if (sVar15 != 0) {
                            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113b38;
                            poVar16 = std::operator<<((ostream *)&std::cout,"M[0] - ");
                            pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)auStack_58 + 0x20);
                            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113b48;
                            poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113b57;
                            poVar16 = std::operator<<(poVar16," --> M[0]");
                            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113b5f;
                            std::endl<char,std::char_traits<char>>(poVar16);
                          }
                          iVar10 = *(int *)&((line_1.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                            _M_dataplus)._M_p;
                          pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)auStack_58 + 0x20);
                          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113b72;
                          iVar11 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                          *(int *)&((line_1.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p = iVar10 - iVar11;
                          goto LAB_0011313c;
                        }
                        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113b8f;
                        bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)auVar6,"sub*");
                        auVar6 = auStack_58;
                        if (bVar8) {
                          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113bab;
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)auStack_78,"verbose",&local_31);
                          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113bbb;
                          sVar15 = std::
                                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                   ::count(local_198,(key_type *)auStack_78);
                          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113bc7;
                          std::__cxx11::string::~string((string *)auStack_78);
                          if (sVar15 != 0) {
                            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113bdf;
                            poVar16 = std::operator<<((ostream *)&std::cout,"M[0] - M[M[");
                            pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)auStack_58 + 0x20);
                            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113bef;
                            poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113bfe;
                            poVar16 = std::operator<<(poVar16,"]] --> M[0]");
                            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113c06;
                            std::endl<char,std::char_traits<char>>(poVar16);
                          }
                          pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)auStack_58 + 0x20);
                          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113c13;
                          iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113c1d;
                          bVar8 = error_registers(iVar10,local_38);
                          if (!bVar8) {
                            pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)auStack_58 + 0x20);
                            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113c32;
                            iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                            iVar10 = *(int *)((long)&((line_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p + (long)iVar10 * 4);
                            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113c43;
                            bVar8 = error_registers(iVar10,local_38);
                            if (!bVar8) {
                              iVar10 = *(int *)&((line_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 )->_M_dataplus)._M_p;
                              pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)auStack_58 + 0x20);
                              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113c5e;
                              iVar11 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                              iVar11 = *(int *)((long)&((line_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p + (long)iVar11 * 4);
                              goto LAB_00113ad0;
                            }
                          }
                        }
                        else {
                          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113c7d;
                          bVar8 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)auVar6,"mul");
                          auVar6 = auStack_58;
                          if (bVar8) {
                            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113c99;
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)auStack_78,"verbose",&local_31);
                            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113ca9;
                            sVar15 = std::
                                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                     ::count(local_198,(key_type *)auStack_78);
                            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113cb5;
                            std::__cxx11::string::~string((string *)auStack_78);
                            if (sVar15 != 0) {
                              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113ccd;
                              poVar16 = std::operator<<((ostream *)&std::cout,"M[0] * M[");
                              pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)auStack_58 + 0x20);
                              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113cdd;
                              poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113cec;
                              poVar16 = std::operator<<(poVar16,"] --> M[0]");
                              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113cf4;
                              std::endl<char,std::char_traits<char>>(poVar16);
                            }
                            pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)auStack_58 + 0x20);
                            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113d01;
                            iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113d0b;
                            bVar8 = error_registers(iVar10,local_38);
                            if (!bVar8) {
                              iVar10 = *(int *)&((line_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 )->_M_dataplus)._M_p;
                              pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)auStack_58 + 0x20);
                              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113d26;
                              iVar11 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
LAB_00113d2c:
                              iVar10 = iVar10 * *(int *)((long)&((line_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p + (long)iVar11 * 4);
                              goto LAB_0011387b;
                            }
                          }
                          else {
                            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113d45;
                            bVar8 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)auVar6,"mul=");
                            auVar6 = auStack_58;
                            if (bVar8) {
                              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113d61;
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)auStack_78,"verbose",&local_31);
                              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113d71;
                              sVar15 = std::
                                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                       ::count(local_198,(key_type *)auStack_78);
                              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113d7d;
                              std::__cxx11::string::~string((string *)auStack_78);
                              if (sVar15 != 0) {
                                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113d95;
                                poVar16 = std::operator<<((ostream *)&std::cout,"M[0] * ");
                                pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)auStack_58 + 0x20);
                                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113da5;
                                poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113db4;
                                poVar16 = std::operator<<(poVar16," --> M[0]");
                                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113dbc;
                                std::endl<char,std::char_traits<char>>(poVar16);
                              }
                              iVar11 = *(int *)&((line_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 )->_M_dataplus)._M_p;
                              pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)auStack_58 + 0x20);
                              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113dcf;
                              iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                              iVar10 = iVar10 * iVar11;
LAB_0011351c:
                              *(int *)&((line_1.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p = iVar10;
                              goto LAB_0011313c;
                            }
                            *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113de7;
                            bVar8 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)auVar6,"mul*");
                            auVar6 = auStack_58;
                            if (bVar8) {
                              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113e03;
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)auStack_78,"verbose",&local_31);
                              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113e13;
                              sVar15 = std::
                                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                       ::count(local_198,(key_type *)auStack_78);
                              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113e1f;
                              std::__cxx11::string::~string((string *)auStack_78);
                              if (sVar15 != 0) {
                                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113e37;
                                poVar16 = std::operator<<((ostream *)&std::cout,"M[0] * M[M[");
                                pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)auStack_58 + 0x20);
                                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113e47;
                                poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113e56;
                                poVar16 = std::operator<<(poVar16,"]] --> M[0]");
                                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113e5e;
                                std::endl<char,std::char_traits<char>>(poVar16);
                              }
                              pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)auStack_58 + 0x20);
                              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113e6b;
                              iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113e75;
                              bVar8 = error_registers(iVar10,local_38);
                              if (!bVar8) {
                                pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)auStack_58 + 0x20);
                                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113e8a;
                                iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                                iVar10 = *(int *)((long)&((line_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p + (long)iVar10 * 4);
                                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113e9b;
                                bVar8 = error_registers(iVar10,local_38);
                                if (!bVar8) {
                                  iVar10 = *(int *)&((line_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p;
                                  pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)auStack_58 + 0x20);
                                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113eb6;
                                  iVar11 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                                  iVar11 = *(int *)((long)&((line_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p + (long)iVar11 * 4);
                                  goto LAB_00113d2c;
                                }
                              }
                            }
                            else {
                              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113ed5;
                              bVar8 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)auVar6,"div");
                              auVar6 = auStack_58;
                              if (!bVar8) {
                                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113fa2;
                                bVar8 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)auVar6,"div=");
                                auVar6 = auStack_58;
                                if (bVar8) {
                                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113fbe;
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)auStack_78,"verbose",&local_31);
                                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113fce;
                                  sVar15 = std::
                                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                           ::count(local_198,(key_type *)auStack_78);
                                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113fda;
                                  std::__cxx11::string::~string((string *)auStack_78);
                                  if (sVar15 != 0) {
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113ff2;
                                    poVar16 = std::operator<<((ostream *)&std::cout,"M[0] / ");
                                    pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)((long)auStack_58 + 0x20);
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114002;
                                    poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114011;
                                    poVar16 = std::operator<<(poVar16," --> M[0]");
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114019;
                                    std::endl<char,std::char_traits<char>>(poVar16);
                                  }
                                  iVar10 = *(int *)&((line_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p;
                                  pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)auStack_58 + 0x20);
                                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11402c;
                                  iVar11 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                                  iVar10 = iVar10 / iVar11;
                                  goto LAB_0011351c;
                                }
                                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114048;
                                bVar8 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)auVar6,"div*");
                                auVar6 = auStack_58;
                                if (bVar8) {
                                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114064;
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)auStack_78,"verbose",&local_31);
                                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114074;
                                  sVar15 = std::
                                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                           ::count(local_198,(key_type *)auStack_78);
                                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114080;
                                  std::__cxx11::string::~string((string *)auStack_78);
                                  if (sVar15 != 0) {
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114098;
                                    poVar16 = std::operator<<((ostream *)&std::cout,"M[0] / M[M[");
                                    pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)((long)auStack_58 + 0x20);
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1140a8;
                                    poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1140b7;
                                    poVar16 = std::operator<<(poVar16,"]] --> M[0]");
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1140bf;
                                    std::endl<char,std::char_traits<char>>(poVar16);
                                  }
                                  pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)auStack_58 + 0x20);
                                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1140cc;
                                  iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1140d6;
                                  bVar8 = error_registers(iVar10,local_38);
                                  if (!bVar8) {
                                    pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)((long)auStack_58 + 0x20);
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1140eb;
                                    iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                                    iVar10 = *(int *)((long)&((line_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p + (long)iVar10 * 4);
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1140fc;
                                    bVar8 = error_registers(iVar10,local_38);
                                    if (!bVar8) {
                                      iVar10 = *(int *)&((line_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p;
                                      pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)((long)auStack_58 + 0x20);
                                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114117;
                                      iVar11 = boost::lexical_cast<int,std::__cxx11::string>
                                                         (pbVar27);
                                      iVar11 = *(int *)((long)&((line_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p + (long)iVar11 * 4);
                                      goto LAB_00113f88;
                                    }
                                  }
                                  goto LAB_001146c1;
                                }
                                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114139;
                                bVar8 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)auVar6,"jmp");
                                auVar6 = auStack_58;
                                if (bVar8) {
LAB_00114155:
                                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114169;
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)auStack_78,"verbose",&local_31);
                                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114179;
                                  sVar15 = std::
                                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                           ::count(local_198,(key_type *)auStack_78);
                                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114185;
                                  std::__cxx11::string::~string((string *)auStack_78);
                                  if (sVar15 != 0) {
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11419d;
                                    poVar16 = std::operator<<((ostream *)&std::cout,
                                                              "Jump to LABEL \'");
                                    pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)((long)auStack_58 + 0x20);
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1141ad;
                                    poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1141bc;
                                    poVar16 = std::operator<<(poVar16,"\'");
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1141c4;
                                    std::endl<char,std::char_traits<char>>(poVar16);
                                  }
                                  pkVar25 = (key_type *)((long)auStack_58 + 0x20);
                                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1141d8;
                                  piVar20 = std::
                                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                            ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                                  *)local_d8,pkVar25);
                                }
                                else {
                                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11414d;
                                  bVar8 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)auVar6,"jump");
                                  auVar6 = auStack_58;
                                  if (bVar8) goto LAB_00114155;
                                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11421b;
                                  bVar8 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)auVar6,"jz");
                                  auVar6 = auStack_58;
                                  if (bVar8) {
                                    if (*(int *)&((line_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p == 0) {
                                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1143b3;
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)auStack_78,"verbose",&local_31);
                                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1143c3;
                                      sVar15 = std::
                                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                               ::count(local_198,(key_type *)auStack_78);
                                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1143cf;
                                      std::__cxx11::string::~string((string *)auStack_78);
                                      if (sVar15 != 0) {
                                        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1143e7;
                                        poVar16 = std::operator<<((ostream *)&std::cout,
                                                                  "Jump to LABEL \'");
                                        pbVar27 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)auStack_58 + 0x20);
                                        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1143f7;
                                        poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                                        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114406;
                                        poVar16 = std::operator<<(poVar16,"\'");
                                        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11440e;
                                        std::endl<char,std::char_traits<char>>(poVar16);
                                      }
                                      pkVar25 = (key_type *)((long)auStack_58 + 0x20);
                                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114422;
                                      piVar20 = std::
                                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                                ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                                  *)local_d8,pkVar25);
                                      goto LAB_001141d8;
                                    }
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114240;
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)auStack_78,"verbose",&local_31);
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114250;
                                    sVar15 = std::
                                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                             ::count(local_198,(key_type *)auStack_78);
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11425c;
                                    std::__cxx11::string::~string((string *)auStack_78);
                                    pcVar12 = "Can\'t jump: M[0] != 0 ";
LAB_0011453e:
                                    poVar16 = (ostream *)&std::cout;
                                    if (sVar15 == 0) goto LAB_0011313c;
LAB_00114547:
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11454c;
                                    poVar16 = std::operator<<(poVar16,pcVar12);
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114554;
                                    std::endl<char,std::char_traits<char>>(poVar16);
                                    goto LAB_0011313c;
                                  }
                                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11427f;
                                  bVar8 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)auVar6,"jgz");
                                  auVar6 = auStack_58;
                                  if (!bVar8) {
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11432c;
                                    bVar8 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)auVar6,"label");
                                    auVar6 = auStack_58;
                                    if (bVar8) {
                                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114348;
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)auStack_78,"verbose",&local_31);
                                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114358;
                                      sVar15 = std::
                                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                               ::count(local_198,(key_type *)auStack_78);
                                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114364;
                                      std::__cxx11::string::~string((string *)auStack_78);
                                      if (sVar15 == 0) goto LAB_0011313c;
                                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114380;
                                      poVar16 = std::operator<<((ostream *)&std::cout,
                                                                "Found LABEL \'");
                                      pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)((long)auStack_58 + 0x20);
                                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114390;
                                      poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                                      pcVar12 = "\'";
                                      goto LAB_00114547;
                                    }
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114437;
                                    bVar8 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)auVar6,"debug");
                                    if (bVar8) {
                                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114453;
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)auStack_78,"verbose",&local_31);
                                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114463;
                                      sVar15 = std::
                                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                               ::count(local_198,(key_type *)auStack_78);
                                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11446f;
                                      std::__cxx11::string::~string((string *)auStack_78);
                                      if (sVar15 == 0) {
                                        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1146d8;
                                        std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::~vector((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)auStack_58);
                                        goto LAB_00114583;
                                      }
                                      pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)((long)auStack_58 + 0x20);
                                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114485;
                                      iVar10 = boost::lexical_cast<int,std::__cxx11::string>
                                                         (pbVar27);
                                      if (iVar10 == 1) {
                                        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1144a1;
                                        poVar16 = std::operator<<((ostream *)&std::cout,
                                                                  "Registers dump: ");
                                        *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1144a9;
                                        std::endl<char,std::char_traits<char>>(poVar16);
                                        for (uVar29 = 0; uVar22 != uVar29; uVar29 = uVar29 + 1) {
                                          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1144cb;
                                          poVar16 = std::operator<<((ostream *)&std::cout,
                                                                    "         M[");
                                          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1144d5;
                                          poVar16 = (ostream *)
                                                    std::ostream::operator<<
                                                              ((ostream *)poVar16,(int)uVar29);
                                          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1144e4;
                                          poVar16 = std::operator<<(poVar16,"] = ");
                                          iVar10 = *(int *)((long)&((line_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p + uVar29 * 4);
                                          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1144f3;
                                          poVar16 = (ostream *)
                                                    std::ostream::operator<<
                                                              ((ostream *)poVar16,iVar10);
                                          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1144fb;
                                          std::endl<char,std::char_traits<char>>(poVar16);
                                        }
                                        goto LAB_0011313c;
                                      }
                                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11467e;
                                      poVar16 = std::operator<<((ostream *)&std::cerr,
                                                                "<!> Invalid debug option \'");
                                      pbVar28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)((long)auStack_58 + 0x20);
                                    }
                                    else {
                                      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114669;
                                      poVar16 = std::operator<<((ostream *)&std::cerr,
                                                                "<!> Syntax error \'");
                                    }
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114691;
                                    know_label._M_t._M_impl.super__Rb_tree_header._M_node_count =
                                         (size_t)std::operator<<(poVar16,(string *)pbVar28);
                                    local_a0 = "\'";
                                    goto LAB_001146a6;
                                  }
                                  if (*(int *)&((line_1.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->_M_dataplus)._M_p < 1) {
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114514;
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)auStack_78,"verbose",&local_31);
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114524;
                                    sVar15 = std::
                                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                             ::count(local_198,(key_type *)auStack_78);
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114530;
                                    std::__cxx11::string::~string((string *)auStack_78);
                                    pcVar12 = "Can\'t jump: M[0] < 0 ";
                                    goto LAB_0011453e;
                                  }
                                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1142a8;
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)auStack_78,"verbose",&local_31);
                                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1142b8;
                                  sVar15 = std::
                                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                           ::count(local_198,(key_type *)auStack_78);
                                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1142c4;
                                  std::__cxx11::string::~string((string *)auStack_78);
                                  if (sVar15 != 0) {
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1142dc;
                                    poVar16 = std::operator<<((ostream *)&std::cout,
                                                              "Jump to LABEL \'");
                                    pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)((long)auStack_58 + 0x20);
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1142ec;
                                    poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1142fb;
                                    poVar16 = std::operator<<(poVar16,"\'");
                                    *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114303;
                                    std::endl<char,std::char_traits<char>>(poVar16);
                                  }
                                  pkVar25 = (key_type *)((long)auStack_58 + 0x20);
                                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114317;
                                  piVar20 = std::
                                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                            ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                                  *)local_d8,pkVar25);
                                }
LAB_001141d8:
                                if (*piVar20 == 0) {
                                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114636;
                                  poVar16 = std::operator<<((ostream *)&std::cerr,"<!> Label \'");
                                  pbVar28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)auStack_58 + 0x20);
                                  *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114646;
                                  know_label._M_t._M_impl.super__Rb_tree_header._M_node_count =
                                       (size_t)std::operator<<(poVar16,(string *)pbVar28);
                                  local_a0 = "\' not found.";
                                  goto LAB_001146a6;
                                }
                                pkVar25 = (key_type *)((long)auStack_58 + 0x20);
                                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1141f5;
                                p_Var21 = (_Ios_Seekdir *)
                                          std::
                                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                          ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                                  *)local_d8,pkVar25);
                                _Var1 = *p_Var21;
                                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114206;
                                std::istream::seekg((long)local_440,_Var1);
                                goto LAB_0011313c;
                              }
                              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113ef1;
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)auStack_78,"verbose",&local_31);
                              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113f01;
                              sVar15 = std::
                                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                                       ::count(local_198,(key_type *)auStack_78);
                              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113f0d;
                              std::__cxx11::string::~string((string *)auStack_78);
                              if (sVar15 != 0) {
                                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113f25;
                                poVar16 = std::operator<<((ostream *)&std::cout,"M[0] / M[");
                                pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)auStack_58 + 0x20);
                                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113f35;
                                poVar16 = std::operator<<(poVar16,(string *)pbVar27);
                                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113f44;
                                poVar16 = std::operator<<(poVar16,"] --> M[0]");
                                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113f4c;
                                std::endl<char,std::char_traits<char>>(poVar16);
                              }
                              pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)auStack_58 + 0x20);
                              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113f59;
                              iVar10 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
                              *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113f63;
                              bVar8 = error_registers(iVar10,local_38);
                              if (!bVar8) {
                                iVar10 = *(int *)&((line_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p;
                                pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)auStack_58 + 0x20);
                                *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x113f7e;
                                iVar11 = boost::lexical_cast<int,std::__cxx11::string>(pbVar27);
LAB_00113f88:
                                *(int *)&((line_1.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p =
                                     iVar10 / *(int *)((long)&((line_1.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p + (long)iVar11 * 4);
                                goto LAB_0011313c;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
LAB_001146c1:
          *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1146ca;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_58);
          goto LAB_00114592;
        }
        goto LAB_00112e3e;
      }
LAB_00114583:
      eCompress = token_compress_on;
      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x114592;
      std::ifstream::close();
LAB_00114592:
      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x11459e;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)local_d8);
      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1145aa;
      std::__cxx11::string::~string((string *)local_108);
      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1145b6;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_98);
      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1145c2;
      std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
      *(undefined8 *)(auStack_518 + lVar3 + -8) = 0x1145ce;
      std::__cxx11::string::~string((string *)local_220);
      uVar24 = fetch.field_2._8_8_;
    }
    *(undefined8 *)(uVar24 + -8) = 0x1145e1;
    std::ifstream::~ifstream(local_440);
    *(undefined8 *)(uVar24 + -8) = 0x1145ed;
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  else {
    uStack_520 = 0x11291d;
    poVar16 = (ostream *)
              boost::program_options::operator<<
                        ((ostream *)&std::cout,(options_description *)(auStack_518 + 8));
    uStack_520 = 0x112925;
    std::endl<char,std::char_traits<char>>(poVar16);
    uStack_520 = 1;
    eCompress = token_compress_off;
    uVar24 = auStack_518;
  }
  *(undefined8 *)(uVar24 + -8) = 0x1145f9;
  boost::program_options::variables_map::~variables_map
            ((variables_map *)(outtape.field_2._M_local_buf + 8));
  *(undefined8 *)(uVar24 + -8) = 0x114605;
  boost::program_options::positional_options_description::~positional_options_description(local_478)
  ;
  *(undefined8 *)(uVar24 + -8) = 0x114611;
  boost::program_options::options_description::~options_description
            ((options_description *)(auStack_518 + 8));
  return eCompress;
}

Assistant:

int main(int argc, char **argv) {
    options_description desc("SimRam - RAM Emulator");
    desc.add_options()
    ("help,h", "prints this")
    ("verbose,v", "enable verbose mode")
    ("registers,r", value<int>(), "set max number of virtual registers")
    ("input,i", value<string>(), "input file")
    ;

    positional_options_description p;
    p.add("input", -1);

    variables_map vm;
    store(command_line_parser(argc, argv).
          options(desc).positional(p).run(), vm);

    notify(vm);

    if(vm.count("help"))
    {
        cout << desc << endl;
        return 1;
    }
    
    int regnumber;
    
    if(vm.count("reg"))
    {
        regnumber = vm["reg"].as<int>();
        if(vm.count("verbose")) cout << "The number of virtual registers was set to " << regnumber << endl;
    } else
    {
        regnumber = REGNUMBER;
    }

    string filename = "input.ram";

    if(vm.count("input"))
    {
        filename = vm["input"].as<string>();
        if(vm.count("verbose")) cout << "The source code was set to '" << filename << "'" << endl;
    }

    ifstream source_file (filename.c_str());

    if (!source_file.is_open())
    {
        cout << "<!> Unable to open file" << endl;
        return EXIT_FAILURE;
    }

    int registers[regnumber];

    memset(registers,0,sizeof(int)*regnumber);

    int inpointer = 0;

    string intapetmp;
    string outtape;
    vector<string> intape;
    
    cout << "Insert input tape (use comma for insert new value): ";
    cin >> intapetmp;
    
    boost::algorithm::split(intape, intapetmp, boost::algorithm::is_any_of(","));
    
    if(vm.count("verbose")) cout<<"There are " << intape.size() <<" values in the tape." << endl;

    string fetch;

    // TODO search LABEL.

    map<string, int> know_label;

    while(!source_file.eof())
    {
        getline(source_file, fetch);

        if(fetch == "halt" || fetch[0] == '#') continue;

        vector<string> line;
        boost::algorithm::split(line, fetch, boost::algorithm::is_any_of(" "));

        if(line[0] == "label") know_label[line[1]] = source_file.tellg();
    }

    source_file.clear();
    source_file.seekg(0, ios::beg);

    while(!source_file.eof())
    {
        // Fetch

        getline(source_file, fetch);

        if(fetch == "halt")
        {
            cout<<"Completed execution with output: "<<outtape<<endl;
            source_file.close();
            return EXIT_SUCCESS;
        } else if(fetch == "" || fetch[0] == '#')
        {
            continue;
        }

        vector<string> line;
        boost::algorithm::split(line, fetch, boost::algorithm::is_any_of(" "));

        // Decode / Execute

        // TODO remove pointer overflow on registers
	// TODO usa una hashmap con comando --> puntatore funzione per migliorare esecuzione.

        if(line[0] == "read")
        {
            if(vm.count("verbose")) cout<<"Read: "<<intape[inpointer]<<" --> M["<<line[1]<<"]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            if(inpointer >= intape.size())
            {
                cerr << "<!> The input tape is finished." << endl;
                return EXIT_FAILURE;
            }
            registers[boost::lexical_cast<int>(line[1])] = boost::lexical_cast<int>(intape[inpointer]);
            inpointer++;

        } else if(line[0] == "read*")
        {
            if(vm.count("verbose")) cout<<"Read: "<<intape[inpointer]<<" --> M[M["<<line[1]<<"]]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            if(error_registers(registers[boost::lexical_cast<int>(line[1])],regnumber)) return EXIT_FAILURE;
            if(inpointer >= intape.size())
            {
                cerr<<"<!> The input tape is finished."<<endl;
                return EXIT_FAILURE;
            }
            registers[registers[boost::lexical_cast<int>(line[1])]] = boost::lexical_cast<int>(intape[inpointer]);
            inpointer++;

        } else if(line[0] == "write")
        {
            if(vm.count("verbose")) cout<<"Write: M["<<line[1]<<"] = "<<registers[boost::lexical_cast<int>(line[1])]<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            outtape += boost::lexical_cast<string>(registers[boost::lexical_cast<int>(line[1])]);

        } else if(line[0] == "write=")
        {
            if(vm.count("verbose")) cout<<"Write: "<<line[1]<<endl;
            outtape += line[1];

        } else if(line[0] == "write*")
        {
            if(vm.count("verbose")) cout<<"Write: M[M["<<line[1]<<"]] = "<<registers[registers[boost::lexical_cast<int>(line[1])]]<<endl;
            outtape += boost::lexical_cast<string>(registers[registers[boost::lexical_cast<int>(line[1])]]);

        } else if(line[0] == "load")
        {
            if(vm.count("verbose")) cout<<"M["<<line[1]<<"] --> Working Memory"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            registers[0] = registers[boost::lexical_cast<int>(line[1])];

        } else if(line[0] == "load=")
        {
            if(vm.count("verbose")) cout<<"Value: "<<line[1]<<" --> Working Memory"<<endl;
            registers[0] = boost::lexical_cast<int>(line[1]);

        } else if(line[0] == "load*")
        {
            if(vm.count("verbose")) cout<<"M[M["<<line[1]<<"]] --> Working Memory"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            if(error_registers(registers[boost::lexical_cast<int>(line[1])],regnumber)) return EXIT_FAILURE;
            registers[0] = registers[registers[boost::lexical_cast<int>(line[1])]];

        } else if(line[0] == "store")
        {
            if(vm.count("verbose")) cout<<"Working Memory --> M["<<line[1]<<"]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            registers[boost::lexical_cast<int>(line[1])] = registers[0];

        } else if(line[0] == "store*")
        {
            if(vm.count("verbose")) cout<<"Working Memory --> M[M["<<line[1]<<"]]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            if(error_registers(registers[boost::lexical_cast<int>(line[1])],regnumber)) return EXIT_FAILURE;
            registers[registers[boost::lexical_cast<int>(line[1])]] = registers[0];

        } else if(line[0] == "add")
        {
            if(vm.count("verbose")) cout<<"M[0] + M["<<line[1]<<"] --> M[0]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            registers[0] = registers[0] + registers[boost::lexical_cast<int>(line[1])];

        } else if(line[0] == "add=")
        {
            if(vm.count("verbose")) cout<<"M[0] + "<<line[1]<<" --> M[0]"<<endl;
            registers[0] = registers[0] + boost::lexical_cast<int>(line[1]);

        } else if(line[0] == "add*")
        {
            if(vm.count("verbose")) cout<<"M[0] + M[M["<<line[1]<<"]] --> M[0]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            if(error_registers(registers[boost::lexical_cast<int>(line[1])],regnumber)) return EXIT_FAILURE;
            registers[0] = registers[0] + registers[registers[boost::lexical_cast<int>(line[1])]];

        } else if(line[0] == "sub")
        {
            if(vm.count("verbose")) cout<<"M[0] - M["<<line[1]<<"] --> M[0]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            registers[0] = registers[0] - registers[boost::lexical_cast<int>(line[1])];

        } else if(line[0] == "sub=")
        {
            if(vm.count("verbose")) cout<<"M[0] - "<<line[1]<<" --> M[0]"<<endl;
            registers[0] = registers[0] - boost::lexical_cast<int>(line[1]);

        } else if(line[0] == "sub*")
        {
            if(vm.count("verbose")) cout<<"M[0] - M[M["<<line[1]<<"]] --> M[0]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            if(error_registers(registers[boost::lexical_cast<int>(line[1])],regnumber)) return EXIT_FAILURE;
            registers[0] = registers[0] - registers[registers[boost::lexical_cast<int>(line[1])]];

        } else if(line[0] == "mul")
        {
            if(vm.count("verbose")) cout<<"M[0] * M["<<line[1]<<"] --> M[0]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            registers[0] = registers[0] * registers[boost::lexical_cast<int>(line[1])];

        } else if(line[0] == "mul=")
        {
            if(vm.count("verbose")) cout<<"M[0] * "<<line[1]<<" --> M[0]"<<endl;
            registers[0] = registers[0] * boost::lexical_cast<int>(line[1]);

        } else if(line[0] == "mul*")
        {
            if(vm.count("verbose")) cout<<"M[0] * M[M["<<line[1]<<"]] --> M[0]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            if(error_registers(registers[boost::lexical_cast<int>(line[1])],regnumber)) return EXIT_FAILURE;
            registers[0] = registers[0] * registers[registers[boost::lexical_cast<int>(line[1])]];

        } else if(line[0] == "div")
        {
            if(vm.count("verbose")) cout<<"M[0] / M["<<line[1]<<"] --> M[0]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            registers[0] = registers[0] / registers[boost::lexical_cast<int>(line[1])];

        } else if(line[0] == "div=")
        {
            if(vm.count("verbose")) cout<<"M[0] / "<<line[1]<<" --> M[0]"<<endl;
            registers[0] = registers[0] / boost::lexical_cast<int>(line[1]);

        } else if(line[0] == "div*")
        {
            if(vm.count("verbose")) cout<<"M[0] / M[M["<<line[1]<<"]] --> M[0]"<<endl;
            if(error_registers(boost::lexical_cast<int>(line[1]),regnumber)) return EXIT_FAILURE;
            if(error_registers(registers[boost::lexical_cast<int>(line[1])],regnumber)) return EXIT_FAILURE;
            registers[0] = registers[0] / registers[registers[boost::lexical_cast<int>(line[1])]];

        } else if(line[0] == "jmp" || line[0] == "jump")
        {
            if(vm.count("verbose")) cout<<"Jump to LABEL '"<<line[1]<<"'"<<endl;
            if(know_label[line[1]] == NULL)
            {
                cerr<<"<!> Label '"<<line[1]<<"' not found."<<endl;
                return EXIT_FAILURE;
            }
            source_file.seekg(know_label[line[1]], ios::beg);

        } else if(line[0] == "jz")
        {
            if(registers[0] == 0)
            {
                if(vm.count("verbose")) cout<<"Jump to LABEL '"<<line[1]<<"'"<<endl;
                if(know_label[line[1]] == NULL)
                {
                    cerr<<"<!> Label '"<<line[1]<<"' not found."<<endl;
                    return EXIT_FAILURE;
                }
                source_file.seekg(know_label[line[1]], ios::beg);
            }
            else
            {
                if(vm.count("verbose")) cout<<"Can't jump: M[0] != 0 "<<endl;
            }

        } else if(line[0] == "jgz")
        {
            if(registers[0] > 0)
            {
                if(vm.count("verbose")) cout<<"Jump to LABEL '"<<line[1]<<"'"<<endl;
                if(know_label[line[1]] == NULL)
                {
                    cerr<<"<!> Label '"<<line[1]<<"' not found."<<endl;
                    return EXIT_FAILURE;
                }
                source_file.seekg(know_label[line[1]], ios::beg);
            }
            else
            {
                if(vm.count("verbose")) cout<<"Can't jump: M[0] < 0 "<<endl;
            }

        } else if(line[0] == "label")
        {
            if(vm.count("verbose")) cout<<"Found LABEL '"<<line[1]<<"'"<<endl;

        } else if(line[0] == "debug")
        {
            if(!vm.count("verbose")) break;
            switch(boost::lexical_cast<int>(line[1]))
            {
            case 1:
                cout<<"Registers dump: "<<endl;
                for(int i = 0; i < regnumber; i++)
                {
                    cout<<"         M["<<i<<"] = "<<registers[i]<<endl;
                }
                break;
            default:
                cerr<<"<!> Invalid debug option '"<<line[1]<<"'"<<endl;
                return EXIT_FAILURE;
            }

        } else
        {
            cerr<<"<!> Syntax error '"<<fetch<<"'"<<endl;
            return EXIT_FAILURE;
        }

    }

    source_file.close();

    return EXIT_SUCCESS;
}